

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O1

int func_extract(int ip)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  byte bVar6;
  char *stptr;
  int iVar7;
  int iVar8;
  int iVar9;
  
  ppuVar4 = __ctype_b_loc();
  iVar8 = ip + -1;
  pcVar5 = prlnbuf + ip;
  do {
    cVar1 = *pcVar5;
    iVar8 = iVar8 + 1;
    pcVar5 = pcVar5 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  pcVar5 = func_line;
  bVar2 = false;
  stptr = "Invalid function argument!";
  iVar3 = 0;
  iVar7 = 0;
  do {
    bVar6 = prlnbuf[iVar8];
    iVar9 = iVar8 + 1;
    if (bVar6 == 0) {
LAB_0010c723:
      *pcVar5 = 0;
      bVar2 = true;
      iVar8 = iVar9;
    }
    else {
      if (bVar6 == 0x5c) {
        *pcVar5 = 0x5c;
        bVar6 = prlnbuf[(long)iVar8 + 1];
        if ((byte)(bVar6 - 0x3a) < 0xf7) goto LAB_0010c775;
        iVar8 = iVar8 + 2;
        iVar7 = iVar7 + 1;
        pcVar5 = (char *)((byte *)pcVar5 + 1);
        if (iVar3 <= (int)(bVar6 - 0x31)) {
          iVar3 = bVar6 - 0x31;
        }
      }
      else {
        iVar8 = iVar9;
        if (bVar6 == 0x3b) goto LAB_0010c723;
      }
      *pcVar5 = bVar6;
      iVar7 = iVar7 + 1;
      if (iVar7 == 0x7f) {
        stptr = "Function line too long!";
LAB_0010c775:
        error(stptr);
        return -1;
      }
    }
    pcVar5 = (char *)((byte *)pcVar5 + 1);
    if (bVar2) {
      return iVar3;
    }
  } while( true );
}

Assistant:

int
func_extract(int ip)
{
	char *ptr;
	char  c;
	int   i, arg, max_arg;
	int   end;

	/* skip spaces */
	while (isspace(prlnbuf[ip]))
		ip++;

	/* get function body */
	ptr = func_line;
	max_arg = 0;
	end = 0;
	i = 0;

	while (!end) {
		c = prlnbuf[ip++];
		switch (c) {
		/* end of line */	
		case ';':
		case '\0':
		   *ptr++ = '\0';
			end = 1;
			break;

		/* function arg */
		case '\\':
		   *ptr++ = c;
		    i++;
			c = prlnbuf[ip++];
			if ((c < '1') || (c > '9')) {
				error("Invalid function argument!");
				return (-1);
			}
			arg = c - '1';
			if (max_arg < arg)
				max_arg = arg;

		/* other */
		default:
		   *ptr++ = c;
		    i++;
			if (i == 127) {
				error("Function line too long!");
				return (-1);
			}
			break;
		}
	}

	/* return the number of args */
	return (max_arg);
}